

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManPrintStatsMiter(Gia_Man_t *p,int fVerbose)

{
  Gia_Man_t *p_00;
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pNode;
  bool bVar3;
  float fVar4;
  int local_30;
  uint local_2c;
  int iObjId;
  int i;
  Vec_Flt_t *vProb;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGStack_10;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  pObj._4_4_ = fVerbose;
  pGStack_10 = p;
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(pGStack_10);
  _iObjId = Gia_ManPrintOutputProb(pGStack_10);
  printf("Statistics for each outputs of the miter:\n");
  local_2c = 0;
  while( true ) {
    uVar2 = local_2c;
    iVar1 = Gia_ManPoNum(pGStack_10);
    bVar3 = false;
    if ((int)uVar2 < iVar1) {
      vProb = (Vec_Flt_t *)Gia_ManCo(pGStack_10,local_2c);
      bVar3 = vProb != (Vec_Flt_t *)0x0;
    }
    if (!bVar3) break;
    local_30 = Gia_ObjId(pGStack_10,(Gia_Obj_t *)vProb);
    printf("%4d : ",(ulong)local_2c);
    uVar2 = Gia_ObjLevelId(pGStack_10,local_30);
    printf("Level = %5d  ",(ulong)uVar2);
    uVar2 = Gia_ManSuppSize(pGStack_10,&local_30,1);
    printf("Supp = %5d  ",(ulong)uVar2);
    uVar2 = Gia_ManConeSize(pGStack_10,&local_30,1);
    printf("Cone = %5d  ",(ulong)uVar2);
    p_00 = pGStack_10;
    pNode = Gia_ObjFanin0((Gia_Obj_t *)vProb);
    uVar2 = Gia_NodeMffcSize(p_00,pNode);
    printf("Mffc = %5d  ",(ulong)uVar2);
    fVar4 = Vec_FltEntry(_iObjId,local_30);
    printf("Prob = %8.4f  ",(double)fVar4);
    printf("\n");
    local_2c = local_2c + 1;
  }
  Vec_FltFree(_iObjId);
  return;
}

Assistant:

void Gia_ManPrintStatsMiter( Gia_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Vec_Flt_t * vProb;
    int i, iObjId;
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    vProb = Gia_ManPrintOutputProb( p );
    printf( "Statistics for each outputs of the miter:\n" );
    Gia_ManForEachPo( p, pObj, i )
    {
        iObjId = Gia_ObjId(p, pObj);
        printf( "%4d : ", i );
        printf( "Level = %5d  ",  Gia_ObjLevelId(p, iObjId) );
        printf( "Supp = %5d  ",   Gia_ManSuppSize(p, &iObjId, 1) );
        printf( "Cone = %5d  ",   Gia_ManConeSize(p, &iObjId, 1) );
        printf( "Mffc = %5d  ",   Gia_NodeMffcSize(p, Gia_ObjFanin0(pObj)) );
        printf( "Prob = %8.4f  ", Vec_FltEntry(vProb, iObjId) );
        printf( "\n" );
    }
    Vec_FltFree( vProb );
}